

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O0

double CountMinterms(DdNode *node,double max,st__table *mintermTable,FILE *fp)

{
  int iVar1;
  double *local_68;
  double *dummy;
  double minNnv;
  double minNv;
  double min;
  DdNode *Nnv;
  DdNode *Nv;
  DdNode *N;
  FILE *fp_local;
  st__table *mintermTable_local;
  double max_local;
  DdNode *node_local;
  
  Nv = (DdNode *)((ulong)node & 0xfffffffffffffffe);
  if (Nv->index == 0x7fffffff) {
    node_local = (DdNode *)max;
    if (node == zero) {
      node_local = (DdNode *)0x0;
    }
  }
  else {
    N = (DdNode *)fp;
    fp_local = (FILE *)mintermTable;
    mintermTable_local = (st__table *)max;
    max_local = (double)node;
    iVar1 = st__lookup(mintermTable,(char *)node,(char **)&local_68);
    if (iVar1 == 0) {
      Nnv = (DdNode *)((ulong)(Nv->type).kids.T ^ (long)(int)(SUB84(max_local,0) & 1));
      min = (double)((ulong)(Nv->type).kids.E ^ (long)(int)(SUB84(max_local,0) & 1));
      minNnv = CountMinterms(Nnv,(double)mintermTable_local,(st__table *)fp_local,(FILE *)N);
      if ((minNnv != -1.0) || (NAN(minNnv))) {
        dummy = (double *)
                CountMinterms((DdNode *)min,(double)mintermTable_local,(st__table *)fp_local,
                              (FILE *)N);
        if (((double)dummy != -1.0) || (NAN((double)dummy))) {
          minNv = minNnv / 2.0 + (double)dummy / 2.0;
          local_68 = (double *)malloc(8);
          if (local_68 == (double *)0x0) {
            node_local = (DdNode *)0xbff0000000000000;
          }
          else {
            *local_68 = minNv;
            iVar1 = st__insert((st__table *)fp_local,(char *)max_local,(char *)local_68);
            if (iVar1 == -10000) {
              fprintf((FILE *)N,"st table insert failed\n");
            }
            node_local = (DdNode *)minNv;
          }
        }
        else {
          node_local = (DdNode *)0xbff0000000000000;
        }
      }
      else {
        node_local = (DdNode *)0xbff0000000000000;
      }
    }
    else {
      node_local = (DdNode *)*local_68;
    }
  }
  return (double)node_local;
}

Assistant:

static double
CountMinterms(
  DdNode * node,
  double  max,
  st__table * mintermTable,
  FILE *fp)
{
    DdNode *N, *Nv, *Nnv;
    double min, minNv, minNnv;
    double *dummy;

    N = Cudd_Regular(node);

    if (cuddIsConstant(N)) {
        if (node == zero) {
            return(0);
        } else {
            return(max);
        }
    }

    /* Return the entry in the table if found. */
    if ( st__lookup(mintermTable, (const char *)node, (char **)&dummy)) {
        min = *dummy;
        return(min);
    }

    Nv = cuddT(N);
    Nnv = cuddE(N);
    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* Recur on the children. */
    minNv = CountMinterms(Nv, max, mintermTable, fp);
    if (minNv == -1.0) return(-1.0);
    minNnv = CountMinterms(Nnv, max, mintermTable, fp);
    if (minNnv == -1.0) return(-1.0);
    min = minNv / 2.0 + minNnv / 2.0;
    /* store 
     */

    dummy = ABC_ALLOC(double, 1);
    if (dummy == NULL) return(-1.0);
    *dummy = min;
    if ( st__insert(mintermTable, (char *)node, (char *)dummy) == st__OUT_OF_MEM) {
        (void) fprintf(fp, "st table insert failed\n");
    }
    return(min);

}